

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandRefactor(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  uint fVerbose;
  uint fUseDcs;
  char *pcVar5;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_44 = 0;
  Extra_UtilGetoptReset();
  local_48 = 1;
  local_3c = 0x10;
  local_40 = 10;
  fUseDcs = 0;
  fVerbose = 0;
LAB_00226598:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Nlzvh"), iVar3 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar4 = "Empty network.\n";
      }
      else if (pNtk->ntkType == ABC_NTK_STRASH) {
        iVar3 = Abc_NtkGetChoiceNum(pNtk);
        if (iVar3 == 0) {
          if (local_40 < 0x10) {
            if ((fUseDcs == 0) || (local_40 < local_3c)) {
              iVar3 = Abc_NtkRefactor(pNtk,local_40,local_3c,local_48,local_44,fUseDcs,fVerbose);
              if (iVar3 != 0) {
                return 0;
              }
              pcVar4 = "Refactoring has failed.\n";
            }
            else {
              pcVar4 = 
              "For don\'t-care to work, containing cone should be larger than collapsed node.\n";
            }
          }
          else {
            pcVar4 = "The cone size cannot exceed 15.\n";
          }
        }
        else {
          pcVar4 = "AIG resynthesis cannot be applied to AIGs with choice nodes.\n";
        }
      }
      else {
        pcVar4 = "This command can only be applied to an AIG (run \"strash\").\n";
      }
      iVar3 = -1;
      goto LAB_0022677b;
    }
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_002266d1:
        Abc_Print(-1,pcVar4);
        goto LAB_002266db;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_3c = uVar2;
    }
    else {
      if (iVar1 == 0x7a) {
        local_44 = local_44 ^ 1;
        goto LAB_00226598;
      }
      if (iVar1 == 100) {
        fUseDcs = fUseDcs ^ 1;
        goto LAB_00226598;
      }
      if (iVar1 == 0x6c) {
        local_48 = local_48 ^ 1;
        goto LAB_00226598;
      }
      if (iVar1 != 0x4e) goto LAB_002266db;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_002266d1;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_40 = uVar2;
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_002266db:
      iVar3 = -2;
      Abc_Print(-2,"usage: refactor [-N <num>] [-lzvh]\n");
      Abc_Print(-2,"\t           performs technology-independent refactoring of the AIG\n");
      Abc_Print(-2,"\t-N <num> : the max support of the collapsed node [default = %d]\n",
                (ulong)local_40);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_48 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-l       : toggle preserving the number of levels [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_44 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-z       : toggle using zero-cost replacements [default = %s]\n",pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar5);
      pcVar4 = "\t-h       : print the command usage\n";
LAB_0022677b:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandRefactor( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int nNodeSizeMax;
    int nConeSizeMax;
    int fUpdateLevel;
    int fUseZeros;
    int fUseDcs;
    int fVerbose;
    extern int Abc_NtkRefactor( Abc_Ntk_t * pNtk, int nNodeSizeMax, int nConeSizeMax, int fUpdateLevel, int fUseZeros, int fUseDcs, int fVerbose );

    // set defaults
    nNodeSizeMax = 10;
    nConeSizeMax = 16;
    fUpdateLevel =  1;
    fUseZeros    =  0;
    fUseDcs      =  0;
    fVerbose     =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nlzvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodeSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodeSizeMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConeSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConeSizeMax < 0 )
                goto usage;
            break;
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'z':
            fUseZeros ^= 1;
            break;
        case 'd':
            fUseDcs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to an AIG (run \"strash\").\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        Abc_Print( -1, "AIG resynthesis cannot be applied to AIGs with choice nodes.\n" );
        return 1;
    }
    if ( nNodeSizeMax > 15 )
    {
        Abc_Print( -1, "The cone size cannot exceed 15.\n" );
        return 1;
    }

    if ( fUseDcs && nNodeSizeMax >= nConeSizeMax )
    {
        Abc_Print( -1, "For don't-care to work, containing cone should be larger than collapsed node.\n" );
        return 1;
    }

    // modify the current network
    if ( !Abc_NtkRefactor( pNtk, nNodeSizeMax, nConeSizeMax, fUpdateLevel, fUseZeros, fUseDcs, fVerbose ) )
    {
        Abc_Print( -1, "Refactoring has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: refactor [-N <num>] [-lzvh]\n" );
    Abc_Print( -2, "\t           performs technology-independent refactoring of the AIG\n" );
    Abc_Print( -2, "\t-N <num> : the max support of the collapsed node [default = %d]\n", nNodeSizeMax );
//    Abc_Print( -2, "\t-C <num> : the max support of the containing cone [default = %d]\n", nConeSizeMax );
    Abc_Print( -2, "\t-l       : toggle preserving the number of levels [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-z       : toggle using zero-cost replacements [default = %s]\n", fUseZeros? "yes": "no" );
//    Abc_Print( -2, "\t-d       : toggle using don't-cares [default = %s]\n", fUseDcs? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}